

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-binary-reader.cc
# Opt level: O2

void __thiscall BinaryReader_DisabledOpcodes_Test::TestBody(BinaryReader_DisabledOpcodes_Test *this)

{
  bool bVar1;
  Enum EVar2;
  char *pcVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  AssertHelper local_108;
  AssertionResult gtest_ar;
  Result result;
  Opcode opcode;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined2 local_d4;
  undefined1 local_d2;
  uchar local_d1;
  uchar local_d0;
  uchar local_cf;
  undefined1 local_ce;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  BinaryReaderError reader;
  ReadBinaryOptions options;
  
  wabt::ReadBinaryOptions::ReadBinaryOptions(&options);
  EVar2 = Unreachable;
  do {
    if (EVar2 == Invalid) {
      return;
    }
    opcode.enum_ = EVar2;
    bVar1 = wabt::Opcode::IsEnabled(&opcode,&options.features);
    if (!bVar1) {
      wabt::Opcode::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,&opcode);
      if (3 < (ulong)((long)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start)) {
        __assert_fail("b.size() <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                      ,0x34,"virtual void BinaryReader_DisabledOpcodes_Test::TestBody()");
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,3);
      local_e8 = 0x16d736100;
      uStack_e0 = 0x203000060010401;
      local_d8 = 0x70a0001;
      local_d4 = 0x501;
      local_d2 = 0;
      local_d1 = *b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_d0 = b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
      local_cf = b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
      local_ce = 0xb;
      reader.super_BinaryReaderNop.super_BinaryReaderDelegate.state = (State *)0x0;
      reader.super_BinaryReaderNop.super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
           (_func_int **)&PTR__BinaryReaderError_002e7208;
      reader.first_error.error_level = Error;
      reader.first_error.loc.field_1.field_0.line = 0;
      reader.first_error.loc.field_1._4_8_ = 0;
      reader.first_error.loc.filename.data_ = (char *)0x0;
      reader.first_error.loc.filename.size_._0_4_ = 0;
      reader.first_error.loc.filename.size_._4_4_ = 0;
      reader.first_error.message._M_dataplus._M_p = (pointer)&reader.first_error.message.field_2;
      reader.first_error.message._M_string_length = 0;
      reader.first_error.message.field_2._M_local_buf[0] = '\0';
      result = wabt::ReadBinary(&local_e8,0x1b,(BinaryReaderDelegate *)&reader,&options);
      local_110.ptr_._0_4_ = 1;
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                ((internal *)&gtest_ar,"Result::Error","result",(Enum *)&local_110,&result);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_110);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                   ,0x43,pcVar3);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_110);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_108.data_._0_4_ = 0;
      local_110.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::find((char *)&reader.first_error.message,0x27b11d);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","message.find(\"unexpected opcode\")",(uint *)&local_108
                 ,(unsigned_long *)&local_110);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_110);
        std::operator<<((ostream *)(local_110.ptr_ + 0x10),"Got error message: ");
        std::operator<<((ostream *)(local_110.ptr_ + 0x10),(string *)&reader.first_error.message);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                   ,0x48,pcVar3);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_110);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      anon_unknown.dwarf_a5c1::BinaryReaderError::~BinaryReaderError(&reader);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    EVar2 = EVar2 + Nop;
  } while( true );
}

Assistant:

TEST(BinaryReader, DisabledOpcodes) {
  // Use the default features.
  ReadBinaryOptions options;

  // Loop through all opcodes.
  for (uint32_t i = 0; i < static_cast<uint32_t>(Opcode::Invalid); ++i) {
    Opcode opcode(static_cast<Opcode::Enum>(i));
    if (opcode.IsEnabled(options.features)) {
      continue;
    }

    // Use a shorter name to make the clang-formatted table below look nicer.
    std::vector<uint8_t> b = opcode.GetBytes();
    assert(b.size() <= 3);
    b.resize(3);

    uint8_t data[] = {
        0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00,  // magic + version
        0x01, 0x04, 0x01, 0x60, 0x00, 0x00,  // type section: 1 type, (func)
        0x03, 0x02, 0x01, 0x00,              // func section: 1 func, type 0
        0x0a, 0x07, 0x01, 0x05, 0x00,        // code section: 1 func, 0 locals
        b[0], b[1], b[2],  // The instruction, padded with zeroes
        0x0b,              // end
    };
    const size_t size = sizeof(data);

    BinaryReaderError reader;
    Result result = ReadBinary(data, size, &reader, options);
    EXPECT_EQ(Result::Error, result);

    // This relies on the binary reader checking whether the opcode is allowed
    // before reading any further data needed by the instruction.
    const std::string& message = reader.first_error.message;
    EXPECT_EQ(0u, message.find("unexpected opcode"))
        << "Got error message: " << message;
  }
}